

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_tests.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  PerformanceTestFramework framework;
  _Rb_tree<std::pair<double,_double>_(*)(),_std::pair<std::pair<double,_double>_(*const)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<std::pair<double,_double>_(*const)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<double,_double>_(*)()>,_std::allocator<std::pair<std::pair<double,_double>_(*const)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_38;
  
  Test_Helper::setRunCount(argc,argv,0x80);
  _Stack_38._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_38._M_impl.super__Rb_tree_header._M_header;
  _Stack_38._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_38._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_38._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_38._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_38._M_impl.super__Rb_tree_header._M_header._M_left;
  addTests_Blob_Detection((PerformanceTestFramework *)&_Stack_38);
  addTests_Filtering((PerformanceTestFramework *)&_Stack_38);
  addTests_Image_Function((PerformanceTestFramework *)&_Stack_38);
  PerformanceTestFramework::run((PerformanceTestFramework *)&_Stack_38);
  std::
  _Rb_tree<std::pair<double,_double>_(*)(),_std::pair<std::pair<double,_double>_(*const)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<std::pair<double,_double>_(*const)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<double,_double>_(*)()>,_std::allocator<std::pair<std::pair<double,_double>_(*const)(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&_Stack_38);
  return 0;
}

Assistant:

int main( int argc, char* argv[] )
{
    // The main purpose of this application is to test everything within library
    // To do this we need an engine (framework) and a bunch of tests
    Performance_Test::setRunCount( argc, argv, 128 );

    // We create a framework
    PerformanceTestFramework framework;

    // We add tests
    addTests_Blob_Detection     ( framework );
    addTests_Filtering          ( framework );
    addTests_Image_Function     ( framework );

    // Just run the framework what will handle all tests
    framework.run();

    return 0;
}